

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::MediaRule>::copyAppend
          (QGenericArrayOps<QCss::MediaRule> *this,MediaRule *b,MediaRule *e)

{
  MediaRule *pMVar1;
  Data *pDVar2;
  Data *pDVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pMVar1 = (this->super_QArrayDataPointer<QCss::MediaRule>).ptr;
    lVar4 = (this->super_QArrayDataPointer<QCss::MediaRule>).size;
    do {
      pDVar2 = (b->media).d.d;
      pMVar1[lVar4].media.d.d = pDVar2;
      pMVar1[lVar4].media.d.ptr = (b->media).d.ptr;
      pMVar1[lVar4].media.d.size = (b->media).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar3 = (b->styleRules).d.d;
      pMVar1[lVar4].styleRules.d.d = pDVar3;
      pMVar1[lVar4].styleRules.d.ptr = (b->styleRules).d.ptr;
      pMVar1[lVar4].styleRules.d.size = (b->styleRules).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar4 = (this->super_QArrayDataPointer<QCss::MediaRule>).size + 1;
      (this->super_QArrayDataPointer<QCss::MediaRule>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }